

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

int __thiscall gl4cts::KHRDebugTests::init(KHRDebugTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  SynchronousCallsTest *this_00;
  
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"api_errors_non_debug",
             "Verifies that errors are generated as expected");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(Context **)((long)&pTVar2[1].m_name.field_2 + 8) = pCVar1;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__APIErrorsTest_0210d200;
  pTVar2[1].m_testCtx = (TestContext *)&PTR__APIErrorsTest_0210d238;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"labels_non_debug",
             "Verifies that labels can be assigned and queried");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(Context **)((long)&pTVar2[1].m_name.field_2 + 8) = pCVar1;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__LabelsTest_0210d258;
  pTVar2[1].m_testCtx = (TestContext *)&PTR__LabelsTest_0210d290;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"receiveing_messages",
             "Verifies that messages can be received");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_string_length = 1;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(Context **)((long)&pTVar2[1].m_name.field_2 + 8) = pCVar1;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__ReceiveingMessagesTest_0210d410;
  pTVar2[1].m_testCtx = (TestContext *)&PTR__ReceiveingMessagesTest_0210d448;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"groups",
             "Verifies that groups can be used to control generated messages");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_string_length = 1;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(Context **)((long)&pTVar2[1].m_name.field_2 + 8) = pCVar1;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__GroupsTest_0210d468;
  pTVar2[1].m_testCtx = (TestContext *)&PTR__GroupsTest_0210d4a0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"api_errors_debug",
             "Verifies that errors are generated as expected");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_string_length = 1;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(Context **)((long)&pTVar2[1].m_name.field_2 + 8) = pCVar1;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__APIErrorsTest_0210d200;
  pTVar2[1].m_testCtx = (TestContext *)&PTR__APIErrorsTest_0210d238;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"labels_debug",
             "Verifies that labels can be assigned and queried");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_string_length = 1;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(Context **)((long)&pTVar2[1].m_name.field_2 + 8) = pCVar1;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__LabelsTest_0210d258;
  pTVar2[1].m_testCtx = (TestContext *)&PTR__LabelsTest_0210d290;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (SynchronousCallsTest *)operator_new(0xb8);
  KHRDebug::SynchronousCallsTest::SynchronousCallsTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void KHRDebugTests::init(void)
{
	addChild(new KHRDebug::APIErrorsTest(m_context, false, "api_errors_non_debug"));
	addChild(new KHRDebug::LabelsTest(m_context, false, "labels_non_debug"));
	addChild(new KHRDebug::ReceiveingMessagesTest(m_context));
	addChild(new KHRDebug::GroupsTest(m_context));
	addChild(new KHRDebug::APIErrorsTest(m_context, true, "api_errors_debug"));
	addChild(new KHRDebug::LabelsTest(m_context, true, "labels_debug"));
	addChild(new KHRDebug::SynchronousCallsTest(m_context));
}